

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildRegisterDefaultCustomRects(ImFontAtlas *atlas)

{
  int iVar1;
  int height;
  
  if (-1 < atlas->CustomRectIds[0]) {
    return;
  }
  if ((atlas->Flags & 2) == 0) {
    height = 0x1b;
    iVar1 = 0xd9;
  }
  else {
    height = 2;
    iVar1 = height;
  }
  iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,0x80000000,iVar1,height);
  atlas->CustomRectIds[0] = iVar1;
  return;
}

Assistant:

void ImFontAtlasBuildRegisterDefaultCustomRects(ImFontAtlas* atlas)
{
    if (atlas->CustomRectIds[0] >= 0)
        return;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_ID, FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF*2+1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
    else
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_ID, 2, 2);
}